

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3BtreeLeave(Btree *p)

{
  long in_RDI;
  
  if ((*(char *)(in_RDI + 0x11) != '\0') &&
     (*(int *)(in_RDI + 0x14) = *(int *)(in_RDI + 0x14) + -1, *(int *)(in_RDI + 0x14) == 0)) {
    unlockBtreeMutex(p);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3BtreeLeave(Btree *p){
  assert( sqlite3_mutex_held(p->db->mutex) );
  if( p->sharable ){
    assert( p->wantToLock>0 );
    p->wantToLock--;
    if( p->wantToLock==0 ){
      unlockBtreeMutex(p);
    }
  }
}